

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall higan::Thread::Thread(Thread *this,string *name,ThreadFunc *function)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->thread_ = 0;
  std::function<void_()>::function(&this->function_,function);
  this->started = false;
  this->joined = false;
  return;
}

Assistant:

Thread::Thread(const std::string& name, const ThreadFunc& function):
		name_(name),
		thread_(),
		function_(function),
		started(false),
		joined(false)
{

}